

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoInput.cpp
# Opt level: O0

Key * PianoInputTU::readRowBindings<Qt::Key*>(QSettings *settings,Key *dest,QString *key)

{
  int iVar1;
  Key KVar2;
  int local_28;
  int i;
  int count;
  QString *key_local;
  Key *dest_local;
  QSettings *settings_local;
  
  iVar1 = QSettings::beginReadArray((QString *)settings);
  key_local = (QString *)dest;
  if (iVar1 == 0x18) {
    key_local = (QString *)dest;
    for (local_28 = 0; local_28 < 0x18; local_28 = local_28 + 1) {
      QSettings::setArrayIndex((int)settings);
      KVar2 = readBinding(settings,(QString *)Keys::key);
      *(Key *)&(key_local->d).d = KVar2;
      key_local = (QString *)((long)&(key_local->d).d + 4);
    }
  }
  QSettings::endArray();
  return (Key *)key_local;
}

Assistant:

static Iter readRowBindings(QSettings &settings, Iter dest, QString const& key) {
    auto count = settings.beginReadArray(key);
    if (count == PianoInput::BindsPerRow) {
        for (int i = 0; i < count; ++i) {
            settings.setArrayIndex(i);
            *dest++ = TU::readBinding(settings, Keys::key);

        }
    }
    settings.endArray();
    return dest;
}